

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_string.c
# Opt level: O1

HPDF_STATUS HPDF_String_Write(HPDF_String obj,HPDF_Stream_conflict stream,HPDF_Encrypt e)

{
  byte bVar1;
  uint len;
  bool bVar2;
  HPDF_ByteType HVar3;
  HPDF_UINT len_00;
  HPDF_STATUS HVar4;
  HPDF_Stream_conflict p_Var5;
  HPDF_BYTE *pHVar6;
  HPDF_String p_Var7;
  ulong uVar8;
  ulong uVar9;
  HPDF_BYTE *out;
  HPDF_ParseText_Rec parse_state;
  HPDF_BYTE buf [512];
  HPDF_UNICODE local_282;
  ulong local_280;
  HPDF_BYTE *local_278;
  ulong local_270;
  HPDF_Encrypt local_268;
  HPDF_Stream_conflict local_260;
  HPDF_String local_258;
  HPDF_ParseText_Rec local_250;
  HPDF_BYTE local_238 [520];
  
  if (e != (HPDF_Encrypt)0x0) {
    HPDF_Encrypt_Reset(e);
  }
  if (obj->encoder == (HPDF_Encoder_conflict)0x0) {
    if (e == (HPDF_Encrypt)0x0) {
      HVar4 = HPDF_Stream_WriteEscapeText(stream,(char *)obj->value);
      return HVar4;
    }
    HVar4 = HPDF_Stream_WriteChar(stream,'<');
    if (HVar4 == 0) {
      pHVar6 = obj->value;
      len_00 = HPDF_StrLen((char *)pHVar6,-1);
      HVar4 = HPDF_Stream_WriteBinary(stream,pHVar6,len_00,e);
      if (HVar4 == 0) {
        HVar4 = HPDF_Stream_WriteChar(stream,'>');
        return HVar4;
      }
    }
  }
  else {
    pHVar6 = obj->value;
    len = obj->len;
    HVar4 = HPDF_Stream_WriteChar(stream,'<');
    if ((HVar4 == 0) && (HVar4 = HPDF_Stream_WriteBinary(stream,UNICODE_HEADER,2,e), HVar4 == 0)) {
      local_268 = e;
      local_260 = stream;
      HPDF_Encoder_SetParseText(obj->encoder,&local_250,pHVar6,len);
      if ((int)len < 1) {
        local_280 = 0;
      }
      else {
        out = local_238;
        uVar8 = 0;
        local_280 = 0;
        local_278 = pHVar6;
        local_270 = (ulong)len;
        local_258 = obj;
        do {
          p_Var7 = local_258;
          bVar1 = pHVar6[uVar8];
          HVar3 = HPDF_Encoder_ByteType(local_258->encoder,&local_250);
          if ((uint)local_280 < 0xff) {
LAB_00133f62:
            pHVar6 = local_278;
            bVar2 = true;
            p_Var5 = stream;
            uVar9 = local_270;
            if (HVar3 != HPDF_BYTE_TYPE_TRAIL) {
              if (HVar3 == HPDF_BYTE_TYPE_LEAD) {
                local_282 = HPDF_Encoder_ToUnicode
                                      (p_Var7->encoder,CONCAT11(bVar1,local_278[uVar8 + 1]));
              }
              else {
                local_282 = HPDF_Encoder_ToUnicode(p_Var7->encoder,(ushort)bVar1);
                pHVar6 = local_278;
              }
              uVar9 = local_270;
              HPDF_UInt16Swap(&local_282);
              HPDF_MemCpy(out,(HPDF_BYTE *)&local_282,2);
              out = out + 2;
              local_280 = (ulong)((int)local_280 + 1);
              bVar2 = true;
            }
          }
          else {
            p_Var5 = (HPDF_Stream_conflict)
                     HPDF_Stream_WriteBinary(local_260,local_238,(uint)local_280 * 2,local_268);
            bVar2 = false;
            pHVar6 = local_278;
            uVar9 = local_270;
            if (p_Var5 == (HPDF_Stream_conflict)0x0) {
              local_280 = 0;
              p_Var7 = local_258;
              out = local_238;
              goto LAB_00133f62;
            }
          }
          if (!bVar2) {
            return (HPDF_STATUS)p_Var5;
          }
          uVar8 = uVar8 + 1;
          stream = p_Var5;
        } while (uVar9 != uVar8);
      }
      p_Var5 = local_260;
      if (((int)local_280 == 0) ||
         (HVar4 = HPDF_Stream_WriteBinary(local_260,local_238,(int)local_280 * 2,local_268),
         HVar4 == 0)) {
        HVar4 = HPDF_Stream_WriteChar(p_Var5,'>');
      }
    }
  }
  return HVar4;
}

Assistant:

HPDF_STATUS
HPDF_String_Write  (HPDF_String   obj,
                    HPDF_Stream   stream,
                    HPDF_Encrypt  e)
{
    HPDF_STATUS ret;

    /*
     *  When encoder is not NULL, text is changed to unicode using encoder,
     *  and it outputs by HPDF_write_binary method.
     */

    HPDF_PTRACE((" HPDF_String_Write\n"));

    if (e)
        HPDF_Encrypt_Reset (e);

    if (obj->encoder == NULL) {
        if (e) {
            if ((ret = HPDF_Stream_WriteChar (stream, '<')) != HPDF_OK)
                return ret;

            if ((ret = HPDF_Stream_WriteBinary (stream, obj->value,
                    HPDF_StrLen ((char *)obj->value, -1), e)) != HPDF_OK)
                return ret;

            return HPDF_Stream_WriteChar (stream, '>');
        } else {
            return HPDF_Stream_WriteEscapeText (stream, (char *)obj->value);
        }
    } else {
        HPDF_BYTE* src = obj->value;
        HPDF_BYTE buf[HPDF_TEXT_DEFAULT_LEN * 2];
        HPDF_UINT tmp_len = 0;
        HPDF_BYTE* pbuf = buf;
        HPDF_INT32 len = obj->len;
        HPDF_ParseText_Rec  parse_state;
        HPDF_UINT i;

        if ((ret = HPDF_Stream_WriteChar (stream, '<')) != HPDF_OK)
           return ret;

        if ((ret = HPDF_Stream_WriteBinary (stream, UNICODE_HEADER, 2, e))
                        != HPDF_OK)
            return ret;

        HPDF_Encoder_SetParseText (obj->encoder, &parse_state, src, len);

        for (i = 0; (HPDF_INT32)i < len; i++) {
            HPDF_BYTE b = src[i];
            HPDF_UNICODE tmp_unicode;
            HPDF_ByteType btype = HPDF_Encoder_ByteType (obj->encoder,
                    &parse_state);

            if (tmp_len >= HPDF_TEXT_DEFAULT_LEN - 1) {
                if ((ret = HPDF_Stream_WriteBinary (stream, buf,
                            tmp_len * 2, e)) != HPDF_OK)
                    return ret;

                tmp_len = 0;
                pbuf = buf;
            }

            if (btype != HPDF_BYTE_TYPE_TRAIL) {
                if (btype == HPDF_BYTE_TYPE_LEAD) {
                    HPDF_BYTE b2 = src[i + 1];
                    HPDF_UINT16 char_code = (HPDF_UINT16)((HPDF_UINT) b * 256 + b2);

                    tmp_unicode = HPDF_Encoder_ToUnicode (obj->encoder,
                                char_code);
                } else {
                    tmp_unicode = HPDF_Encoder_ToUnicode (obj->encoder, b);
                }

                HPDF_UInt16Swap (&tmp_unicode);
                HPDF_MemCpy (pbuf, (HPDF_BYTE*)&tmp_unicode, 2);
                pbuf += 2;
                tmp_len++;
            }
        }

        if (tmp_len > 0) {
            if ((ret = HPDF_Stream_WriteBinary (stream, buf, tmp_len * 2, e))
                            != HPDF_OK)
                return ret;
        }

        if ((ret = HPDF_Stream_WriteChar (stream, '>')) != HPDF_OK)
            return ret;
    }

    return HPDF_OK;
}